

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O2

Id dxil_spv::emit_load_node_input_push_pointer(Impl *impl,Id ptr_id,Id type_id,uint32_t alignment)

{
  Id IVar1;
  Builder *pBVar2;
  Operation *this;
  Operation *this_00;
  
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makePointer(pBVar2,StorageClassPhysicalStorageBuffer,type_id);
  this = Converter::Impl::allocate(impl,OpAccessChain,IVar1);
  Operation::add_id(this,ptr_id);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintConstant(pBVar2,0,false);
  Operation::add_id(this,IVar1);
  Converter::Impl::add(impl,this,false);
  this_00 = Converter::Impl::allocate(impl,OpLoad,type_id);
  Operation::add_id(this_00,this->id);
  Operation::add_literal(this_00,2);
  Operation::add_literal(this_00,4);
  Converter::Impl::add(impl,this_00,false);
  return this_00->id;
}

Assistant:

static spv::Id emit_load_node_input_push_pointer(
	Converter::Impl &impl, spv::Id ptr_id, spv::Id type_id, uint32_t alignment)
{
	auto *access_chain = impl.allocate(spv::OpAccessChain, impl.builder().makePointer(
		spv::StorageClassPhysicalStorageBuffer, type_id));
	access_chain->add_id(ptr_id);
	access_chain->add_id(impl.builder().makeUintConstant(0));
	impl.add(access_chain);

	auto *load_op = impl.allocate(spv::OpLoad, type_id);
	load_op->add_id(access_chain->id);
	load_op->add_literal(spv::MemoryAccessAlignedMask);
	load_op->add_literal(alignment);
	impl.add(load_op);

	return load_op->id;
}